

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDebugger.h
# Opt level: O2

void __thiscall moira::Debugger::Debugger(Debugger *this,Moira *ref)

{
  _Rb_tree_header *p_Var1;
  
  this->moira = ref;
  Breakpoints::Breakpoints(&this->breakpoints,ref);
  Watchpoints::Watchpoints(&this->watchpoints,this->moira);
  Catchpoints::Catchpoints(&this->catchpoints,this->moira);
  p_Var1 = &(this->swTraps).traps._M_t._M_impl.super__Rb_tree_header;
  (this->swTraps).traps._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->swTraps).traps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->swTraps).traps._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->swTraps).traps._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->swTraps).traps._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->softStop).super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._M_engaged = false;
  this->logCnt = 0;
  return;
}

Assistant:

Debugger(Moira& ref) : moira(ref) { }